

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O2

void highbd_bilinear_filter
               (uint16_t *src,int src_stride,int xoffset,int yoffset,uint16_t *dst,int w,int h)

{
  uint16_t *puVar1;
  undefined8 uVar2;
  uint uVar3;
  uint16_t *puVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  uint16_t uVar8;
  uint16_t uVar9;
  uint16_t uVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  uint16_t uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar28 [16];
  undefined1 auVar24 [16];
  undefined1 auVar29 [16];
  undefined1 auVar25 [16];
  undefined1 auVar30 [16];
  
  lVar5 = (long)w;
  if (xoffset == 0) {
    puVar4 = dst;
    for (iVar6 = 0; iVar6 <= h; iVar6 = iVar6 + 1) {
      for (lVar7 = 0; lVar7 < lVar5; lVar7 = lVar7 + 8) {
        uVar2 = *(undefined8 *)(src + lVar7 + 4);
        *(undefined8 *)(puVar4 + lVar7) = *(undefined8 *)(src + lVar7);
        *(undefined8 *)(puVar4 + lVar7 + 4) = uVar2;
      }
      puVar4 = puVar4 + (uint)w;
      src = src + src_stride;
    }
  }
  else if (xoffset == 4) {
    puVar4 = dst;
    for (iVar6 = 0; iVar6 <= h; iVar6 = iVar6 + 1) {
      for (lVar7 = 0; lVar7 < lVar5; lVar7 = lVar7 + 8) {
        puVar1 = src + lVar7;
        uVar8 = pavgw(puVar1[1],*puVar1);
        uVar9 = pavgw(puVar1[2],puVar1[1]);
        uVar10 = pavgw(puVar1[3],puVar1[2]);
        uVar11 = pavgw(puVar1[4],puVar1[3]);
        uVar12 = pavgw(puVar1[5],puVar1[4]);
        uVar13 = pavgw(puVar1[6],puVar1[5]);
        uVar14 = pavgw(puVar1[7],puVar1[6]);
        uVar15 = pavgw(src[lVar7 + 8],puVar1[7]);
        puVar1 = puVar4 + lVar7;
        *puVar1 = uVar8;
        puVar1[1] = uVar9;
        puVar1[2] = uVar10;
        puVar1[3] = uVar11;
        puVar1[4] = uVar12;
        puVar1[5] = uVar13;
        puVar1[6] = uVar14;
        puVar1[7] = uVar15;
      }
      puVar4 = puVar4 + (uint)w;
      src = src + src_stride;
    }
  }
  else {
    uVar3 = (uint)bilinear_filters_2t[xoffset][1] << 0x10 | (uint)bilinear_filters_2t[xoffset][0];
    auVar19._4_4_ = uVar3;
    auVar19._0_4_ = uVar3;
    auVar19._8_4_ = uVar3;
    auVar19._12_4_ = uVar3;
    puVar4 = dst;
    for (iVar6 = 0; iVar6 <= h; iVar6 = iVar6 + 1) {
      for (lVar7 = 0; lVar7 < lVar5; lVar7 = lVar7 + 8) {
        auVar16 = *(undefined1 (*) [16])(src + lVar7);
        auVar25._0_12_ = auVar16._0_12_;
        auVar25._12_2_ = auVar16._6_2_;
        auVar25._14_2_ = auVar16._8_2_;
        auVar24._12_4_ = auVar25._12_4_;
        auVar24._0_10_ = auVar16._0_10_;
        auVar24._10_2_ = auVar16._6_2_;
        auVar23._10_6_ = auVar24._10_6_;
        auVar23._0_8_ = auVar16._0_8_;
        auVar23._8_2_ = auVar16._4_2_;
        auVar22._8_8_ = auVar23._8_8_;
        auVar22._6_2_ = auVar16._4_2_;
        auVar21._0_4_ = auVar16._0_4_;
        auVar22._4_2_ = auVar16._2_2_;
        auVar22._0_4_ = auVar21._0_4_;
        auVar21._4_12_ = auVar22._4_12_;
        auVar31 = pmaddwd(auVar21,auVar19);
        auVar26._0_4_ = auVar31._0_4_ + 0x40U >> 7;
        auVar26._4_4_ = auVar31._4_4_ + 0x40U >> 7;
        auVar26._8_4_ = auVar31._8_4_ + 0x40U >> 7;
        auVar26._12_4_ = auVar31._12_4_ + 0x40U >> 7;
        auVar31._0_4_ = auVar16._8_4_;
        auVar31._4_2_ = auVar16._10_2_;
        auVar31._6_2_ = auVar16._12_2_;
        auVar31._8_2_ = auVar16._12_2_;
        auVar31._10_2_ = auVar16._14_2_;
        auVar31._12_2_ = auVar16._14_2_;
        auVar31._14_2_ = src[lVar7 + 8];
        auVar16 = pmaddwd(auVar31,auVar19);
        auVar17._0_4_ = auVar16._0_4_ + 0x40U >> 7;
        auVar17._4_4_ = auVar16._4_4_ + 0x40U >> 7;
        auVar17._8_4_ = auVar16._8_4_ + 0x40U >> 7;
        auVar17._12_4_ = auVar16._12_4_ + 0x40U >> 7;
        auVar16 = packssdw(auVar26,auVar17);
        *(undefined1 (*) [16])(puVar4 + lVar7) = auVar16;
      }
      puVar4 = puVar4 + (uint)w;
      src = src + src_stride;
    }
  }
  if (yoffset != 0) {
    if (yoffset == 4) {
      iVar6 = 0;
      if (h < 1) {
        h = 0;
      }
      for (; iVar6 != h; iVar6 = iVar6 + 1) {
        for (lVar7 = 0; lVar7 < lVar5; lVar7 = lVar7 + 8) {
          puVar4 = dst + lVar7;
          puVar1 = dst + lVar5 + lVar7;
          uVar8 = pavgw(*puVar1,*puVar4);
          uVar9 = pavgw(puVar1[1],puVar4[1]);
          uVar10 = pavgw(puVar1[2],puVar4[2]);
          uVar11 = pavgw(puVar1[3],puVar4[3]);
          uVar12 = pavgw(puVar1[4],puVar4[4]);
          uVar13 = pavgw(puVar1[5],puVar4[5]);
          uVar14 = pavgw(puVar1[6],puVar4[6]);
          uVar15 = pavgw(puVar1[7],puVar4[7]);
          puVar4 = dst + lVar7;
          *puVar4 = uVar8;
          puVar4[1] = uVar9;
          puVar4[2] = uVar10;
          puVar4[3] = uVar11;
          puVar4[4] = uVar12;
          puVar4[5] = uVar13;
          puVar4[6] = uVar14;
          puVar4[7] = uVar15;
        }
        dst = dst + (uint)w;
      }
    }
    else {
      uVar3 = (uint)bilinear_filters_2t[yoffset][1] << 0x10 | (uint)bilinear_filters_2t[yoffset][0];
      iVar6 = 0;
      if (h < 1) {
        h = iVar6;
      }
      auVar16._4_4_ = uVar3;
      auVar16._0_4_ = uVar3;
      auVar16._8_4_ = uVar3;
      auVar16._12_4_ = uVar3;
      for (; iVar6 != h; iVar6 = iVar6 + 1) {
        for (lVar7 = 0; lVar7 < lVar5; lVar7 = lVar7 + 8) {
          auVar19 = *(undefined1 (*) [16])(dst + lVar7);
          puVar4 = dst + lVar5 + lVar7;
          auVar30._0_12_ = auVar19._0_12_;
          auVar30._12_2_ = auVar19._6_2_;
          auVar30._14_2_ = puVar4[3];
          auVar29._12_4_ = auVar30._12_4_;
          auVar29._0_10_ = auVar19._0_10_;
          auVar29._10_2_ = puVar4[2];
          auVar28._10_6_ = auVar29._10_6_;
          auVar28._0_8_ = auVar19._0_8_;
          auVar28._8_2_ = auVar19._4_2_;
          auVar27._8_8_ = auVar28._8_8_;
          auVar27._6_2_ = puVar4[1];
          auVar27._4_2_ = auVar19._2_2_;
          auVar27._0_2_ = auVar19._0_2_;
          auVar27._2_2_ = *puVar4;
          auVar31 = pmaddwd(auVar27,auVar16);
          auVar32._0_4_ = auVar31._0_4_ + 0x40U >> 7;
          auVar32._4_4_ = auVar31._4_4_ + 0x40U >> 7;
          auVar32._8_4_ = auVar31._8_4_ + 0x40U >> 7;
          auVar32._12_4_ = auVar31._12_4_ + 0x40U >> 7;
          auVar18._2_2_ = puVar4[4];
          auVar18._0_2_ = auVar19._8_2_;
          auVar18._4_2_ = auVar19._10_2_;
          auVar18._6_2_ = puVar4[5];
          auVar18._8_2_ = auVar19._12_2_;
          auVar18._10_2_ = puVar4[6];
          auVar18._12_2_ = auVar19._14_2_;
          auVar18._14_2_ = puVar4[7];
          auVar19 = pmaddwd(auVar18,auVar16);
          auVar20._0_4_ = auVar19._0_4_ + 0x40U >> 7;
          auVar20._4_4_ = auVar19._4_4_ + 0x40U >> 7;
          auVar20._8_4_ = auVar19._8_4_ + 0x40U >> 7;
          auVar20._12_4_ = auVar19._12_4_ + 0x40U >> 7;
          auVar19 = packssdw(auVar32,auVar20);
          *(undefined1 (*) [16])(dst + lVar7) = auVar19;
        }
        dst = dst + (uint)w;
      }
    }
  }
  return;
}

Assistant:

static void highbd_bilinear_filter(const uint16_t *src, int src_stride,
                                   int xoffset, int yoffset, uint16_t *dst,
                                   int w, int h) {
  int i, j;
  // Horizontal filter
  if (xoffset == 0) {
    uint16_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      for (j = 0; j < w; j += 8) {
        __m128i x = _mm_loadu_si128((__m128i *)&src[j]);
        _mm_storeu_si128((__m128i *)&b[j], x);
      }
      src += src_stride;
      b += w;
    }
  } else if (xoffset == 4) {
    uint16_t *b = dst;
    for (i = 0; i < h + 1; ++i) {
      for (j = 0; j < w; j += 8) {
        __m128i x = _mm_loadu_si128((__m128i *)&src[j]);
        __m128i y = _mm_loadu_si128((__m128i *)&src[j + 8]);
        __m128i z = _mm_alignr_epi8(y, x, 2);
        _mm_storeu_si128((__m128i *)&b[j], _mm_avg_epu16(x, z));
      }
      src += src_stride;
      b += w;
    }
  } else {
    uint16_t *b = dst;
    const uint8_t *hfilter = bilinear_filters_2t[xoffset];
    const __m128i hfilter_vec = _mm_set1_epi32(hfilter[0] | (hfilter[1] << 16));
    for (i = 0; i < h + 1; ++i) {
      for (j = 0; j < w; j += 8) {
        const __m128i x = _mm_loadu_si128((__m128i *)&src[j]);
        const __m128i y = _mm_loadu_si128((__m128i *)&src[j + 8]);
        const __m128i z = _mm_alignr_epi8(y, x, 2);
        const __m128i res = highbd_filter_block(x, z, hfilter_vec);
        _mm_storeu_si128((__m128i *)&b[j], res);
      }

      src += src_stride;
      b += w;
    }
  }

  // Vertical filter
  if (yoffset == 0) {
    // The data is already in 'dst', so no need to filter
  } else if (yoffset == 4) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 8) {
        __m128i x = _mm_loadu_si128((__m128i *)&dst[j]);
        __m128i y = _mm_loadu_si128((__m128i *)&dst[j + w]);
        _mm_storeu_si128((__m128i *)&dst[j], _mm_avg_epu16(x, y));
      }
      dst += w;
    }
  } else {
    const uint8_t *vfilter = bilinear_filters_2t[yoffset];
    const __m128i vfilter_vec = _mm_set1_epi32(vfilter[0] | (vfilter[1] << 16));
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 8) {
        const __m128i x = _mm_loadu_si128((__m128i *)&dst[j]);
        const __m128i y = _mm_loadu_si128((__m128i *)&dst[j + w]);
        const __m128i res = highbd_filter_block(x, y, vfilter_vec);
        _mm_storeu_si128((__m128i *)&dst[j], res);
      }

      dst += w;
    }
  }
}